

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void upb_Arena_Free(upb_Arena *a)

{
  upb_ArenaInternal *puVar1;
  ulong uVar2;
  upb_AllocCleanupFunc *puVar3;
  upb_MemBlock *puVar4;
  uintptr_t uVar5;
  char *pcVar6;
  upb_ArenaInternal *puVar7;
  upb_MemBlock *puVar8;
  upb_Arena *puVar9;
  char *parent_or_count;
  upb_alloc *puVar10;
  bool bVar11;
  
  puVar7 = (upb_ArenaInternal *)(a + 1);
  puVar9 = a + 2;
  do {
    parent_or_count = puVar9->ptr_dont_copy_me__upb_internal_use_only;
    while (((ulong)parent_or_count & 1) != 0) {
      if (parent_or_count == (char *)0x3) {
        uVar5 = _upb_Arena_RefCountFromTagged(puVar7->parent_or_count);
        if (uVar5 != 1) {
          __assert_fail("_upb_Arena_RefCountFromTagged(ai->parent_or_count) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                        ,0x1d8,"void _upb_Arena_DoFree(upb_ArenaInternal *)");
        }
        do {
          if (puVar7 == (upb_ArenaInternal *)0x0) {
            return;
          }
          puVar1 = puVar7->next;
          uVar2 = puVar7->block_alloc;
          puVar8 = puVar7->blocks;
          if ((puVar8 != (upb_MemBlock *)0x0) && (puVar8->next != (upb_MemBlock *)0x0)) {
            puVar8->size_or_hint = puVar7[-1].space_allocated - (long)puVar8;
          }
          puVar10 = (upb_alloc *)(uVar2 & 0xfffffffffffffffe);
          puVar3 = puVar7->upb_alloc_cleanup;
          while (puVar8 != (upb_MemBlock *)0x0) {
            if (puVar10 == (upb_alloc *)0x0) {
              __assert_fail("alloc",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/alloc.h"
                            ,0x36,"void upb_free_sized(upb_alloc *, void *, size_t)");
            }
            puVar4 = puVar8->next;
            (*puVar10->func)(puVar10,puVar8,puVar8->size_or_hint,0);
            puVar8 = puVar4;
          }
          puVar7 = puVar1;
          if (puVar3 != (upb_AllocCleanupFunc *)0x0) {
            (*puVar3)(puVar10);
          }
        } while( true );
      }
      uVar5 = _upb_Arena_RefCountFromTagged((uintptr_t)parent_or_count);
      LOCK();
      pcVar6 = (char *)puVar7->parent_or_count;
      bVar11 = parent_or_count == pcVar6;
      if (bVar11) {
        puVar7->parent_or_count = uVar5 * 2 - 1;
        pcVar6 = parent_or_count;
      }
      UNLOCK();
      parent_or_count = pcVar6;
      if (bVar11) {
        return;
      }
    }
    puVar7 = _upb_Arena_PointerFromTagged((uintptr_t)parent_or_count);
    puVar9 = (upb_Arena *)&puVar7->parent_or_count;
  } while( true );
}

Assistant:

void upb_Arena_Free(upb_Arena* a) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  // Cannot be replaced with _upb_Arena_FindRoot, as that provides only a
  // relaxed read of the refcount if ai is already the root.
  uintptr_t poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
retry:
  while (_upb_Arena_IsTaggedPointer(poc)) {
    ai = _upb_Arena_PointerFromTagged(poc);
    UPB_TSAN_CHECK_PUBLISHED(ai);
    poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
  }

  // compare_exchange or fetch_sub are RMW operations, which are more
  // expensive then direct loads.  As an optimization, we only do RMW ops
  // when we need to update things for other threads to see.
  if (poc == _upb_Arena_TaggedFromRefcount(1)) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogFree(a);
#endif
    _upb_Arena_DoFree(ai);
    return;
  }

  if (upb_Atomic_CompareExchangeWeak(
          &ai->parent_or_count, &poc,
          _upb_Arena_TaggedFromRefcount(_upb_Arena_RefCountFromTagged(poc) - 1),
          memory_order_release, memory_order_acquire)) {
    // We were >1 and we decremented it successfully, so we are done.
    return;
  }

  // We failed our update, so someone has done something, retry the whole
  // process, but the failed exchange reloaded `poc` for us.
  goto retry;
}